

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_do_more(connectdata *conn,int *completep)

{
  CURLcode CVar1;
  _Bool local_41;
  void *pvStack_40;
  _Bool serv_conned;
  FTP *ftp;
  _Bool complete;
  _Bool connected;
  anon_union_224_10_26c073a1_for_proto *paStack_30;
  CURLcode result;
  ftp_conn *ftpc;
  SessionHandle *data;
  int *completep_local;
  connectdata *conn_local;
  
  ftpc = (ftp_conn *)conn->data;
  paStack_30 = &conn->proto;
  ftp._4_4_ = CURLE_OK;
  ftp._3_1_ = 0;
  ftp._2_1_ = 0;
  pvStack_40 = (((SessionHandle *)ftpc)->req).protop;
  data = (SessionHandle *)completep;
  completep_local = (int *)conn;
  if (((conn->bits).tcpconnect[1] & 1U) == 0) {
    if (conn->tunnel_state[1] == TUNNEL_CONNECT) {
      CVar1 = Curl_proxyCONNECT(conn,1,(char *)0x0,0,false);
      return CVar1;
    }
    ftp._4_4_ = Curl_is_connected(conn,1,(_Bool *)((long)&ftp + 3));
    if ((ftp._3_1_ & 1) == 0) {
      if (ftp._4_4_ == CURLE_OK) {
        return CURLE_OK;
      }
      if ((paStack_30->ftpc).count1 != 0) {
        return ftp._4_4_;
      }
      *(undefined4 *)&data->next = 0xffffffff;
      CVar1 = ftp_epsv_disable((connectdata *)completep_local);
      return CVar1;
    }
    if ((*(byte *)((long)completep_local + 0x28a) & 1) != 0) {
      Curl_infof((SessionHandle *)ftpc,"Connection to proxy confirmed\n");
      ftp._4_4_ = proxy_magic((connectdata *)completep_local,(paStack_30->ftpc).newhost,
                              (paStack_30->ftpc).newport,(_Bool *)((long)&ftp + 3));
    }
  }
  if ((paStack_30->ftpc).state != FTP_STOP) {
    CVar1 = ftp_multi_statemach((connectdata *)completep_local,(_Bool *)((long)&ftp + 2));
    *(uint *)&data->next = (uint)(ftp._2_1_ & 1);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    if (((paStack_30->ftpc).wait_data_conn & 1U) != 1) {
      return CURLE_OK;
    }
    ftp._4_4_ = CURLE_OK;
    if (((paStack_30->ftpc).wait_data_conn & 1U) != 0) {
      *(undefined4 *)&data->next = 0;
    }
  }
  if (*(uint *)((long)pvStack_40 + 0x18) < 2) {
    if (((paStack_30->ftpc).wait_data_conn & 1U) == 1) {
      ftp._4_4_ = ReceivedServerConnect((connectdata *)completep_local,&local_41);
      if (ftp._4_4_ != CURLE_OK) {
        return ftp._4_4_;
      }
      CVar1 = CURLE_OK;
      if ((local_41 & 1U) != 0) {
        ftp._4_4_ = AcceptServerConnect((connectdata *)completep_local);
        (paStack_30->ftpc).wait_data_conn = false;
        if (ftp._4_4_ == CURLE_OK) {
          ftp._4_4_ = InitiateTransfer((connectdata *)completep_local);
        }
        if (ftp._4_4_ != CURLE_OK) {
          return ftp._4_4_;
        }
        *(undefined4 *)&data->next = 1;
        CVar1 = ftp._4_4_;
      }
    }
    else if ((ftpc[5].pp.sendleft & 0x100) == 0) {
      *(undefined8 *)((long)pvStack_40 + 0x20) = 0xffffffffffffffff;
      ftp._4_4_ = ftp_range((connectdata *)completep_local);
      if (ftp._4_4_ == CURLE_OK) {
        if (((ftpc[5].pp.field_0x25 & 1) == 0) && ((paStack_30->ftpc).file != (char *)0x0)) {
          CVar1 = ftp_nb_type((connectdata *)completep_local,(_Bool)(ftpc[5].pp.field_0x23 & 1),
                              FTP_RETR_TYPE);
          if (CVar1 != CURLE_OK) {
            return CVar1;
          }
          ftp._4_4_ = CURLE_OK;
        }
        else if (*(int *)((long)pvStack_40 + 0x18) == 0) {
          CVar1 = ftp_nb_type((connectdata *)completep_local,true,FTP_LIST_TYPE);
          if (CVar1 != CURLE_OK) {
            return CVar1;
          }
          ftp._4_4_ = CURLE_OK;
        }
      }
      CVar1 = ftp_multi_statemach((connectdata *)completep_local,(_Bool *)((long)&ftp + 2));
      *(uint *)&data->next = (uint)(ftp._2_1_ & 1);
    }
    else {
      ftp._4_4_ = ftp_nb_type((connectdata *)completep_local,(_Bool)(ftpc[5].pp.field_0x23 & 1),
                              FTP_STOR_TYPE);
      if (ftp._4_4_ != CURLE_OK) {
        return ftp._4_4_;
      }
      CVar1 = ftp_multi_statemach((connectdata *)completep_local,(_Bool *)((long)&ftp + 2));
      *(uint *)&data->next = (uint)(ftp._2_1_ & 1);
    }
    ftp._4_4_ = CVar1;
    conn_local._4_4_ = ftp._4_4_;
  }
  else {
    if ((ftp._4_4_ == CURLE_OK) && (*(int *)((long)pvStack_40 + 0x18) != 0)) {
      Curl_setup_transfer((connectdata *)completep_local,-1,-1,false,(curl_off_t *)0x0,-1,
                          (curl_off_t *)0x0);
    }
    if (((paStack_30->ftpc).wait_data_conn & 1U) == 0) {
      *(undefined4 *)&data->next = 1;
    }
    conn_local._4_4_ = ftp._4_4_;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode ftp_do_more(struct connectdata *conn, int *completep)
{
  struct SessionHandle *data=conn->data;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  CURLcode result = CURLE_OK;
  bool connected = FALSE;
  bool complete = FALSE;

  /* the ftp struct is inited in ftp_connect() */
  struct FTP *ftp = data->req.protop;

  /* if the second connection isn't done yet, wait for it */
  if(!conn->bits.tcpconnect[SECONDARYSOCKET]) {
    if(conn->tunnel_state[SECONDARYSOCKET] == TUNNEL_CONNECT) {
      /* As we're in TUNNEL_CONNECT state now, we know the proxy name and port
         aren't used so we blank their arguments. TODO: make this nicer */
      result = Curl_proxyCONNECT(conn, SECONDARYSOCKET, NULL, 0, FALSE);

      return result;
    }

    result = Curl_is_connected(conn, SECONDARYSOCKET, &connected);

    /* Ready to do more? */
    if(connected) {
      DEBUGF(infof(data, "DO-MORE connected phase starts\n"));
      if(conn->bits.proxy) {
        infof(data, "Connection to proxy confirmed\n");
        result = proxy_magic(conn, ftpc->newhost, ftpc->newport, &connected);
      }
    }
    else {
      if(result && (ftpc->count1 == 0)) {
        *completep = -1; /* go back to DOING please */
        /* this is a EPSV connect failing, try PASV instead */
        return ftp_epsv_disable(conn);
      }
      return result;
    }
  }

  if(ftpc->state) {
    /* already in a state so skip the intial commands.
       They are only done to kickstart the do_more state */
    result = ftp_multi_statemach(conn, &complete);

    *completep = (int)complete;

    /* if we got an error or if we don't wait for a data connection return
       immediately */
    if(result || (ftpc->wait_data_conn != TRUE))
      return result;

    if(ftpc->wait_data_conn)
      /* if we reach the end of the FTP state machine here, *complete will be
         TRUE but so is ftpc->wait_data_conn, which says we need to wait for
         the data connection and therefore we're not actually complete */
      *completep = 0;
  }

  if(ftp->transfer <= FTPTRANSFER_INFO) {
    /* a transfer is about to take place, or if not a file name was given
       so we'll do a SIZE on it later and then we need the right TYPE first */

    if(ftpc->wait_data_conn == TRUE) {
      bool serv_conned;

      result = ReceivedServerConnect(conn, &serv_conned);
      if(result)
        return result; /* Failed to accept data connection */

      if(serv_conned) {
        /* It looks data connection is established */
        result = AcceptServerConnect(conn);
        ftpc->wait_data_conn = FALSE;
        if(!result)
          result = InitiateTransfer(conn);

        if(result)
          return result;

        *completep = 1; /* this state is now complete when the server has
                           connected back to us */
      }
    }
    else if(data->set.upload) {
      result = ftp_nb_type(conn, data->set.prefer_ascii, FTP_STOR_TYPE);
      if(result)
        return result;

      result = ftp_multi_statemach(conn, &complete);
      *completep = (int)complete;
    }
    else {
      /* download */
      ftp->downloadsize = -1; /* unknown as of yet */

      result = ftp_range(conn);
      if(result)
        ;
      else if(data->set.ftp_list_only || !ftpc->file) {
        /* The specified path ends with a slash, and therefore we think this
           is a directory that is requested, use LIST. But before that we
           need to set ASCII transfer mode. */

        /* But only if a body transfer was requested. */
        if(ftp->transfer == FTPTRANSFER_BODY) {
          result = ftp_nb_type(conn, TRUE, FTP_LIST_TYPE);
          if(result)
            return result;
        }
        /* otherwise just fall through */
      }
      else {
        result = ftp_nb_type(conn, data->set.prefer_ascii, FTP_RETR_TYPE);
        if(result)
          return result;
      }

      result = ftp_multi_statemach(conn, &complete);
      *completep = (int)complete;
    }
    return result;
  }

  if(!result && (ftp->transfer != FTPTRANSFER_BODY))
    /* no data to transfer. FIX: it feels like a kludge to have this here
       too! */
    Curl_setup_transfer(conn, -1, -1, FALSE, NULL, -1, NULL);

  if(!ftpc->wait_data_conn) {
    /* no waiting for the data connection so this is now complete */
    *completep = 1;
    DEBUGF(infof(data, "DO-MORE phase ends with %d\n", (int)result));
  }

  return result;
}